

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O2

void __thiscall
ktxValidator::addIssue<unsigned_int,unsigned_int>
          (ktxValidator *this,severity severity,issue *issue,uint args,uint args_1)

{
  undefined1 local_50 [40];
  
  ::issue::issue((issue *)local_50,issue);
  logger::addIssue<unsigned_int,unsigned_int>(&this->logger,severity,(issue *)local_50,args,args_1);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  return;
}

Assistant:

void addIssue(logger::severity severity, issue issue, Args ... args)
    {
        logger.addIssue(severity, issue, args...);
    }